

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_list.c
# Opt level: O2

int qc_list_removefirst(QcList *list,void *data)

{
  QcListEntry *entry;
  QcListEntry *cur;
  QcListEntry *pQVar1;
  bool bVar2;
  
  if (list == (QcList *)0x0) {
    fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_list.c"
            ,0x2da);
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_list.c"
                  ,0x2da,"int qc_list_removefirst(QcList *, void *)");
  }
  entry = list->head;
  list->cur = entry;
  if (entry != (QcListEntry *)0x0) goto LAB_0010481b;
  pQVar1 = (QcListEntry *)0x0;
  while( true ) {
    if (entry == (QcListEntry *)0x0) {
      return -1;
    }
    if (entry->data == data) break;
    bVar2 = pQVar1 != (QcListEntry *)0x0;
    entry = pQVar1;
    pQVar1 = (QcListEntry *)0x0;
    if (bVar2) {
LAB_0010481b:
      pQVar1 = entry->next;
      list->cur = pQVar1;
    }
  }
  qc_list_removeentry(list,entry);
  return 0;
}

Assistant:

int qc_list_removefirst(QcList *list, void *data){
    QcListEntry *entry = NULL;
    qc_assert(list);

    qc_list_enumbegin(list);

    entry = qc_list_enumentry(list);
    while(entry){
        if(entry->data == data){
            qc_list_removeentry(list, entry);
            return 0;
        }
        entry = qc_list_enumentry(list);
    }

    return -1;
}